

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

uint_t __thiscall shm_test::ClientReaderThread::threadFunc(ClientReaderThread *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  uint_t uVar3;
  ulong uVar4;
  C *pCVar5;
  ulong uVar6;
  Array<char,_axl::sl::ArrayDetails<char>_> buffer;
  int local_6c;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_68;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_50;
  
  local_68.m_p = (char *)0x0;
  local_68.m_hdr = (Hdr *)0x0;
  local_68.m_count = 0;
  uVar6 = 0;
  local_6c = 0;
  do {
    if (0x3ffffff < uVar6) {
      uVar3 = 0;
      printf("\nReading 100%% (done), %zd bytes\n",uVar6);
      goto LAB_0011dbdc;
    }
    iVar2 = (**this->m_transport->_vptr_Transport)(this->m_transport,&local_68);
    uVar4 = CONCAT44(extraout_var,iVar2);
    if (uVar4 == 0xffffffffffffffff) {
      axl::err::getLastErrorDescription();
      pCVar5 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      if (local_50.m_length != 0) {
        pCVar5 = local_50.m_p;
      }
      printf("client: read error: %s\n",pCVar5);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_50);
LAB_0011db53:
      bVar1 = false;
    }
    else {
      if (uVar4 < 8) {
        puts("client: buffer too small");
        goto LAB_0011db53;
      }
      if ((*(uint *)local_68.m_p == 1) && ((ulong)*(uint *)((long)local_68.m_p + 4) + 8 == uVar4)) {
        uVar6 = uVar6 + *(uint *)((long)local_68.m_p + 4);
        uVar4 = uVar6 * 100 >> 0x1a;
        bVar1 = true;
        iVar2 = (int)uVar4;
        if (local_6c != iVar2) {
          printf("\b\b\b\b%d%%",uVar4 & 0xffffffff);
          local_6c = iVar2;
        }
      }
      else {
        bVar1 = false;
        printf("client: invalid reply: %d (%d)\n",(ulong)*(uint *)local_68.m_p,
               (ulong)*(uint *)((long)local_68.m_p + 4));
      }
    }
  } while (bVar1);
  uVar3 = 0xffffffff;
LAB_0011dbdc:
  axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_68);
  return uVar3;
}

Assistant:

uint_t
	threadFunc() {
		ASSERT(m_transport);

		int percentage = 0;
		size_t totalSize = 0;

		sl::Array<char> buffer;

		while (totalSize < TotalSize) {
			size_t receivedSize = m_transport->readMessage(&buffer);
			if (receivedSize == -1) {
				printf("client: read error: %s\n", err::getLastErrorDescription().sz());
				return -1;
			}

			if (receivedSize < sizeof(ReqHdr)) {
				printf("client: buffer too small\n");
				return -1;
			}

			ReqHdr* reply = (ReqHdr*)buffer.cp();
			if (reply->m_code != ReqCode_Reply || sizeof(ReqHdr) + reply->m_size != receivedSize) {
				printf("client: invalid reply: %d (%d)\n", reply->m_code, reply->m_size);
				return -1;
			}

			totalSize += reply->m_size;

			int newPercentage = (uint64_t)totalSize * 100 / TotalSize;
			if (newPercentage != percentage) {
				percentage = newPercentage;
				printf("\b\b\b\b%d%%", percentage);
			}
		}

		printf("\nReading 100%% (done), %zd bytes\n", totalSize);
		return 0;
	}